

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

INT MAPFileMapToMmapFlags(DWORD flags)

{
  INT IVar1;
  
  if ((flags == 2) || (flags == 6)) {
    IVar1 = 3;
  }
  else {
    if (flags != 4) {
      fprintf(_stderr,"] %s %s:%d","MAPFileMapToMmapFlags",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
              ,0x6cb);
      fprintf(_stderr,"Unknown flag. This line should not have been executed.\n");
      return -1;
    }
    IVar1 = 1;
  }
  if (PAL_InitializeChakraCoreCalled) {
    return IVar1;
  }
  abort();
}

Assistant:

static INT MAPFileMapToMmapFlags( DWORD flags )
{
    if ( FILE_MAP_READ == flags )
    {
        TRACE( "FILE_MAP_READ\n" );
        return PROT_READ;
    }
    else if ( FILE_MAP_WRITE == flags )
    {
        TRACE( "FILE_MAP_WRITE\n" );
        /* The limitation of x86 architecture
        means you cant have writable but not readable
        page. In Windows maps of FILE_MAP_WRITE can still be
        read from. */
        return PROT_WRITE | PROT_READ;
    }
    else if ( (FILE_MAP_READ|FILE_MAP_WRITE) == flags )
    {
        TRACE( "FILE_MAP_READ|FILE_MAP_WRITE\n" );
        return PROT_READ | PROT_WRITE;
    }
    else if( FILE_MAP_COPY == flags)
    {
        TRACE( "FILE_MAP_COPY\n");
        return PROT_READ | PROT_WRITE;
    } 

    ASSERT( "Unknown flag. This line should not have been executed.\n" );
    return -1;
}